

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::initUserPIN(Token *this,ByteString *pin)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  long in_RDI;
  ByteString userPINBlob;
  ByteString soPINBlob;
  MutexLocker lock;
  SecureDataManager *in_stack_ffffffffffffff18;
  undefined5 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff25;
  byte in_stack_ffffffffffffff26;
  byte in_stack_ffffffffffffff27;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined1 local_68 [60];
  undefined4 local_2c;
  CK_RV local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
             (Mutex *)in_stack_ffffffffffffff18);
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_8 = 5;
    local_2c = 1;
  }
  else {
    bVar2 = SecureDataManager::setUserPIN
                      ((SecureDataManager *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (ByteString *)
                       CONCAT17(in_stack_ffffffffffffff27,
                                CONCAT16(in_stack_ffffffffffffff26,
                                         CONCAT15(in_stack_ffffffffffffff25,
                                                  in_stack_ffffffffffffff20))));
    if (bVar2) {
      plVar1 = *(long **)(in_RDI + 0x10);
      SecureDataManager::getUserPINBlob(in_stack_ffffffffffffff18);
      bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_68);
      uVar4 = (uint)(bVar3 & 1);
      ByteString::~ByteString((ByteString *)0x1ee323);
      if (uVar4 == 0) {
        local_8 = 5;
        local_2c = 1;
      }
      else {
        ByteString::ByteString((ByteString *)0x1ee378);
        ByteString::ByteString((ByteString *)0x1ee384);
        in_stack_ffffffffffffff27 =
             (**(code **)(**(long **)(in_RDI + 0x10) + 8))(*(long **)(in_RDI + 0x10),local_90);
        in_stack_ffffffffffffff26 = 0;
        if ((in_stack_ffffffffffffff27 & 1) != 0) {
          in_stack_ffffffffffffff25 =
               (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),local_b8);
          in_stack_ffffffffffffff26 = in_stack_ffffffffffffff25;
        }
        *(byte *)(in_RDI + 8) = in_stack_ffffffffffffff26 & 1;
        local_8 = 0;
        local_2c = 1;
        ByteString::~ByteString((ByteString *)0x1ee40b);
        ByteString::~ByteString((ByteString *)0x1ee415);
      }
    }
    else {
      local_8 = 5;
      local_2c = 1;
    }
  }
  MutexLocker::~MutexLocker
            ((MutexLocker *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))));
  return local_8;
}

Assistant:

CK_RV Token::initUserPIN(ByteString& pin)
{
	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	if (sdm->setUserPIN(pin) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setUserPIN(sdm->getUserPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	return CKR_OK;
}